

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

void __thiscall BasePort::BroadcastReadInfo::PrintTiming(BroadcastReadInfo *this,ostream *outStr)

{
  _Setprecision _Var1;
  _Setw _Var2;
  ostream *poVar3;
  double dVar4;
  char *local_b0;
  char *local_78;
  double bdTimeDiff_us;
  double bdTime_us;
  uint bnum;
  uint num_bds;
  ostream *outStr_local;
  BroadcastReadInfo *this_local;
  
  bdTime_us._4_4_ = 0;
  std::operator<<(outStr,"Updates (usec): ");
  for (bdTime_us._0_4_ = 0; bdTime_us._0_4_ < 0x10; bdTime_us._0_4_ = bdTime_us._0_4_ + 1) {
    if ((this->boardInfo[bdTime_us._0_4_].inUse & 1U) != 0) {
      dVar4 = this->boardInfo[bdTime_us._0_4_].updateTime;
      poVar3 = (ostream *)std::ostream::operator<<(outStr,bdTime_us._0_4_);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::fixed);
      _Var1 = std::setprecision(2);
      poVar3 = std::operator<<(poVar3,_Var1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4 * 1000000.0);
      std::operator<<(poVar3,"   ");
      bdTime_us._4_4_ = bdTime_us._4_4_ + 1;
    }
  }
  dVar4 = (this->updateFinishTime - this->updateStartTime) * 1000000.0;
  poVar3 = std::operator<<(outStr,"Range: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::fixed);
  _Var1 = std::setprecision(2);
  poVar3 = std::operator<<(poVar3,_Var1);
  std::ostream::operator<<(poVar3,dVar4);
  if (1 < bdTime_us._4_4_) {
    poVar3 = std::operator<<(outStr," (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4 / (double)(bdTime_us._4_4_ - 1));
    std::operator<<(poVar3,") ");
  }
  if ((this->updateOverflow & 1U) == 0) {
    local_78 = "   ";
  }
  else {
    local_78 = "OVF";
  }
  std::operator<<(outStr,local_78);
  std::ostream::operator<<(outStr,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(outStr,"Read start: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::fixed);
  _Var1 = std::setprecision(2);
  poVar3 = std::operator<<(poVar3,_Var1);
  _Var2 = std::setw(6);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->readStartTime * 1000000.0);
  poVar3 = std::operator<<(poVar3,"  finish: ");
  _Var2 = std::setw(6);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->readFinishTime * 1000000.0);
  poVar3 = std::operator<<(poVar3,"  delta: ");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,(this->readFinishTime - this->readStartTime) * 1000000.0)
  ;
  poVar3 = std::operator<<(poVar3,"  gap: ");
  _Var2 = std::setw(6);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,this->gapTime * 1000000.0);
  if (((this->gapTimeMin != 1.0) || (NAN(this->gapTimeMin))) &&
     ((this->gapTimeMax != 0.0 || (NAN(this->gapTimeMax))))) {
    poVar3 = std::operator<<(outStr," (min ");
    _Var2 = std::setw(6);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->gapTimeMin * 1000000.0);
    poVar3 = std::operator<<(poVar3,", max ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->gapTimeMax * 1000000.0);
    std::operator<<(poVar3,") ");
  }
  if ((this->readOverflow & 1U) == 0) {
    local_b0 = "   ";
  }
  else {
    local_b0 = "OVF";
  }
  std::operator<<(outStr,local_b0);
  std::ostream::operator<<(outStr,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BasePort::BroadcastReadInfo::PrintTiming(std::ostream &outStr) const
{
    unsigned int num_bds = 0;
    outStr << "Updates (usec): ";
    for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++) {
        if (boardInfo[bnum].inUse) {
            double bdTime_us = boardInfo[bnum].updateTime*1e6;
            outStr << bnum << ": " << std::fixed << std::setprecision(2) << bdTime_us
                   << "   ";
            num_bds++;
        }
    }
    double bdTimeDiff_us = (updateFinishTime-updateStartTime)*1e6;
    outStr << "Range: " << std::fixed << std::setprecision(2) << bdTimeDiff_us;
    if (num_bds > 1)
        outStr << " (" << (bdTimeDiff_us/(num_bds-1)) << ") ";
    outStr << (updateOverflow ? "OVF" : "   ");
    outStr << std::endl;
    outStr << "Read start: " << std::fixed << std::setprecision(2) << std::setw(6) << (readStartTime*1e6)
           << "  finish: " << std::setw(6) << (readFinishTime*1e6) << "  delta: " << ((readFinishTime-readStartTime)*1e6)
           << "  gap: " << std::setw(6) << (gapTime*1e6);
    if ((gapTimeMin != 1.0) && (gapTimeMax != 0.0)) {
        outStr << " (min " << std::setw(6) << (gapTimeMin*1e6) << ", max " << (gapTimeMax*1e6) << ") ";
    }
    outStr << (readOverflow ? "OVF" : "   ");
    outStr << std::endl;
}